

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlSBufCleanup(xmlSBuf *buf,xmlParserCtxtPtr ctxt,char *errMsg)

{
  char *errMsg_local;
  xmlParserCtxtPtr ctxt_local;
  xmlSBuf *buf_local;
  
  if (buf->code != XML_ERR_OK) {
    xmlSBufReportError(buf,ctxt,errMsg);
  }
  (*xmlFree)(buf->mem);
  return;
}

Assistant:

static void
xmlSBufCleanup(xmlSBuf *buf, xmlParserCtxtPtr ctxt, const char *errMsg) {
    if (buf->code != XML_ERR_OK)
        xmlSBufReportError(buf, ctxt, errMsg);

    xmlFree(buf->mem);
}